

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

void __thiscall
PerspectiveCamera::dump
          (PerspectiveCamera *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
          *t)

{
  mapped_type *pmVar1;
  pair<ParamType,_void_*> pVar2;
  allocator local_41;
  key_type local_40;
  
  pVar2 = dump_element(0);
  std::__cxx11::string::string((string *)&local_40,"camera_type",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = pVar2.first;
  pmVar1->second = pVar2.second;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"camera_center",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = PT_VECTOR3F;
  pmVar1->second = &(this->super_Camera).center;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"camera_direction",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = PT_VECTOR3F;
  pmVar1->second = &(this->super_Camera).direction;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"camera_up",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = PT_VECTOR3F;
  pmVar1->second = &(this->super_Camera).up;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"camera_horizontal",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = PT_VECTOR3F;
  pmVar1->second = &(this->super_Camera).horizontal;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"camera_dist",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = PT_FLOAT;
  pmVar1->second = &this->dist;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"camera_width",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = PT_INT;
  pmVar1->second = &(this->super_Camera).width;
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_40,"camera_height",&local_41);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ParamType,_void_*>_>_>_>
           ::operator[](t,&local_40);
  pmVar1->first = PT_INT;
  pmVar1->second = &(this->super_Camera).height;
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void dump(std::map<std::string, std::pair<ParamType, void*>>& t) override{
#define DUMP(p,q) t[p]=dump_element(q)
		DUMP("camera_type", (int)PERSPECTIVECAM);
		DUMP("camera_center", &center);
		DUMP("camera_direction", &direction);
		DUMP("camera_up", &up);
		DUMP("camera_horizontal", &horizontal);
		DUMP("camera_dist", &dist);
		DUMP("camera_width", &width);
		DUMP("camera_height", &height);
#undef DUMP
	}